

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_delta_lflevel(AV1_COMMON *cm,aom_reader *r,aom_cdf_prob *cdf,MB_MODE_INFO *mbmi,int mi_col,
                      int mi_row)

{
  int iVar1;
  char *in_RCX;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  int sign;
  int thr;
  int rem_bits;
  int smallval;
  int abs;
  int read_delta_lf_flag;
  int b_row;
  int b_col;
  BLOCK_SIZE bsize;
  int reduced_delta_lflevel;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  bool local_51;
  int local_40;
  int local_2c;
  
  local_2c = 0;
  local_51 = (in_R8D & *(int *)(*(long *)(in_RDI + 0x6088) + 0x20) - 1U) == 0 &&
             (in_R9D & *(int *)(*(long *)(in_RDI + 0x6088) + 0x20) - 1U) == 0;
  if (((*in_RCX != *(char *)(*(long *)(in_RDI + 0x6088) + 0x1c)) || (in_RCX[0x90] == '\0')) &&
     (local_51)) {
    local_40 = aom_read_symbol_((aom_reader *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (aom_cdf_prob *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    if (2 < local_40) {
      iVar1 = aom_read_literal_((aom_reader *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff9c);
      local_40 = aom_read_literal_((aom_reader *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c);
      local_40 = local_40 + (1 << ((char)iVar1 + 1U & 0x1f)) + 1;
    }
    if (local_40 == 0) {
      local_58 = 1;
    }
    else {
      local_58 = aom_read_bit_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    local_2c = local_40;
    if (local_58 != 0) {
      local_2c = -local_40;
    }
  }
  return local_2c;
}

Assistant:

static int read_delta_lflevel(const AV1_COMMON *const cm, aom_reader *r,
                              aom_cdf_prob *const cdf,
                              const MB_MODE_INFO *const mbmi, int mi_col,
                              int mi_row) {
  int reduced_delta_lflevel = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int b_col = mi_col & (cm->seq_params->mib_size - 1);
  const int b_row = mi_row & (cm->seq_params->mib_size - 1);
  const int read_delta_lf_flag = (b_col == 0 && b_row == 0);

  if ((bsize != cm->seq_params->sb_size || mbmi->skip_txfm == 0) &&
      read_delta_lf_flag) {
    int abs = aom_read_symbol(r, cdf, DELTA_LF_PROBS + 1, ACCT_STR);
    const int smallval = (abs < DELTA_LF_SMALL);
    if (!smallval) {
      const int rem_bits = aom_read_literal(r, 3, ACCT_STR) + 1;
      const int thr = (1 << rem_bits) + 1;
      abs = aom_read_literal(r, rem_bits, ACCT_STR) + thr;
    }
    const int sign = abs ? aom_read_bit(r, ACCT_STR) : 1;
    reduced_delta_lflevel = sign ? -abs : abs;
  }
  return reduced_delta_lflevel;
}